

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::
     PostWalker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
     ::operator()(Collector *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  PostWalker<Collector,_wasm::Visitor<Collector,_void>_> *pPVar5;
  _func_void_Collector_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_0079e72a;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_0079e3ad:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_0079e72a;
    }
    local_38 = pEVar1 + 2;
    local_40 = operator();
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>)
                    .super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>.
                    super_Walker<Collector,_wasm::Visitor<Collector,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
    }
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,operator(),(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0079e2f2;
  case LoopId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_0079e72a;
    }
    goto LAB_0079df54;
  case BreakId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_0079e72a;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = operator();
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>)
                    .super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>.
                    super_Walker<Collector,_wasm::Visitor<Collector,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_0079db69;
  case SwitchId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_0079e72a;
    }
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,operator(),(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x0079d8f7;
  case CallId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_0079e72a;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079e3ad;
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_0079e72a;
    }
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,operator(),(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_0079e3ad;
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_0079e72a;
    }
    break;
  case LocalSetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e056;
  case GlobalGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_0079e72a;
    }
    break;
  case GlobalSetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_0079e72a;
    }
    goto LAB_0079df54;
  case LoadId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_0079e2f2;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_0079e72a;
  case StoreId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e01b;
  case ConstId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_0079e72a;
    }
    break;
  case UnaryId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e056;
  case BinaryId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2d2;
  case SelectId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_0079e72a;
    }
    goto LAB_0079dc48;
  case DropId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case ReturnId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_0079e72a;
    }
    goto LAB_0079d8ee;
  case MemorySizeId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_0079e72a;
    }
    break;
  case MemoryGrowId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case NopId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_0079e72a;
    }
    break;
  case UnreachableId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_0079e72a;
    }
    break;
  case AtomicRMWId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e101;
  case AtomicCmpxchgId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e0e7;
  case AtomicWaitId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_0079e72a;
    }
    goto LAB_0079d775;
  case AtomicNotifyId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2d2;
  case AtomicFenceId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_0079e72a;
    }
    break;
  case SIMDExtractId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e056;
  case SIMDReplaceId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_0079e72a;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_0079e2dd;
  case SIMDShuffleId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e244;
  case SIMDTernaryId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_0079e72a;
    }
    goto LAB_0079d775;
  case SIMDShiftId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2d2;
  case SIMDLoadId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_0079e72a;
    }
    goto LAB_0079de7d;
  case SIMDLoadStoreLaneId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_0079e72a;
    }
LAB_0079e01b:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_0079e2f2;
  case MemoryInitId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_0079e72a;
    }
LAB_0079e0e7:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)(pEVar1 + 3));
    goto LAB_0079e101;
  case DataDropId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_0079e72a;
    }
    break;
  case MemoryCopyId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_0079e72a;
    }
    goto LAB_0079dc48;
  case MemoryFillId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_0079e72a;
    }
    goto LAB_0079dc48;
  case PopId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_0079e72a;
    }
    break;
  case RefNullId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_0079e72a;
    }
    break;
  case RefIsNullId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case RefFuncId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_0079e72a;
    }
    break;
  case RefEqId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e244;
  case TableGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_0079e72a;
    }
    goto LAB_0079df54;
  case TableSetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e101;
  case TableSizeId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_0079e72a;
    }
    break;
  case TableGrowId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_0079e72a;
    }
LAB_0079e101:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_0079e2f2;
  case TryId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_0079e72a;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_0079e3ad;
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_0079df54:
    pEVar1 = pEVar1 + 2;
    goto LAB_0079e2f2;
  case ThrowId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_0079e72a;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_0079e3ad;
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_0079e72a;
    }
    break;
  case TupleMakeId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_0079e72a;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079e3ad;
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case I31NewId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case I31GetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case CallRefId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_0079e72a;
    }
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,operator(),(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079e3ad;
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case RefCastId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case BrOnId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_0079e72a;
    }
LAB_0079de7d:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_0079e2f2;
  case StructNewId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_0079e72a;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079e3ad;
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e056;
  case StructSetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2d2;
  case ArrayNewId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_0079e72a;
    }
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,operator(),(Expression **)&pEVar1[1].type);
LAB_0079d8ee:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x0079d8f7:
    if (lVar4 != 0) {
LAB_0079db69:
      local_40 = operator();
      SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>)
                    .super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>.
                    super_Walker<Collector,_wasm::Visitor<Collector,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_0079e72a;
    }
    goto LAB_0079d99e;
  case ArrayNewFixedId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_0079e72a;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079e3ad;
        Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
        ::operator()(pPVar5,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e244;
  case ArraySetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_0079e72a;
    }
    goto LAB_0079dc48;
  case ArrayLenId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2a6;
  case ArrayCopyId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_0079e72a;
    }
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,operator(),(Expression **)(pEVar1 + 3));
    goto LAB_0079d70f;
  case ArrayFillId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_0079e72a;
    }
LAB_0079d70f:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)&pEVar1[2].type);
    goto LAB_0079dc48;
  case ArrayInitId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_0079e72a;
    }
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,operator(),(Expression **)(pEVar1 + 4));
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,operator(),(Expression **)&pEVar1[3].type);
LAB_0079d99e:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_0079e2f2;
  case RefAsId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e056;
  case StringNewId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id == StringNewId) {
      local_38 = pEVar1 + 3;
      local_40 = operator();
      if (*(long *)(pEVar1 + 3) != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
        ::operator()(&(self->
                      super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
                      ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>.
                      super_Walker<Collector,_wasm::Visitor<Collector,_void>_>.stack,&local_40,
                     (Expression ***)&local_38);
      }
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = operator();
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
        ::operator()(&(self->
                      super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
                      ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>.
                      super_Walker<Collector,_wasm::Visitor<Collector,_void>_>.stack,&local_40,
                     (Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = operator();
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
        ::operator()(&(self->
                      super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
                      ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>.
                      super_Walker<Collector,_wasm::Visitor<Collector,_void>_>.stack,&local_40,
                     (Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_0079e2f2;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_0079e72a;
  case StringConstId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_0079e72a;
    }
    break;
  case StringMeasureId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e056;
  case StringEncodeId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
              ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar5,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                        ::operator(),currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = operator();
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
        ::operator()(&(self->
                      super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>
                      ).super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>.
                      super_Walker<Collector,_wasm::Visitor<Collector,_void>_>.stack,&local_40,
                     (Expression ***)&local_38);
      }
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar5,operator(),(Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_0079e2f2;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_0079e72a:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,__function);
  case StringConcatId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e244;
  case StringEqId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e2d2;
  case StringAsId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_0079e72a;
    }
LAB_0079e056:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0079e2f2;
  case StringWTF8AdvanceId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_0079e72a;
    }
LAB_0079dc48:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)(pEVar1 + 2));
    goto LAB_0079e244;
  case StringWTF16GetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_0079e72a;
    }
    goto LAB_0079e244;
  case StringIterNextId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_0079e72a;
    }
LAB_0079e2a6:
    pEVar1 = pEVar1 + 1;
LAB_0079e2f2:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_0079e72a;
    }
LAB_0079e2d2:
    currp_00 = pEVar1 + 2;
LAB_0079e2dd:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0079e2f2;
  case StringSliceWTFId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_0079e72a;
    }
LAB_0079d775:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_0079e2dd;
  case StringSliceIterId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_0079e72a;
    }
LAB_0079e244:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0079e2f2;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }